

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_q3_K_ref(float *x,block_q3_K *y,int64_t k)

{
  block_q3_K *pbVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  block_q3_K *pbVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  byte bVar19;
  bool bVar20;
  int j_3;
  uint uVar21;
  int iVar22;
  long lVar23;
  anon_union_4_2_5fd15f10 fp32_1;
  float fVar24;
  uint uVar25;
  char *pcVar26;
  uint8_t *puVar27;
  int iVar28;
  char *pcVar29;
  uint8_t *puVar30;
  int i;
  long lVar31;
  ulong uVar32;
  float *pfVar33;
  int j;
  long lVar34;
  int n_changed;
  short sVar35;
  anon_union_4_2_5fd15f10 fp32;
  float fVar36;
  float fVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  ulong local_1a0;
  uint local_188;
  undefined4 uStack_184;
  uint uStack_180;
  uint uStack_17c;
  float afStack_178 [16];
  char local_138 [8];
  undefined8 uStack_130;
  undefined1 auStack_118 [32];
  undefined1 auStack_f8 [32];
  undefined1 local_d8 [136];
  float scales [16];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar37;
  undefined6 uVar38;
  
  auVar17 = _DAT_0014e7c0;
  auVar16 = _DAT_0014e790;
  auVar15 = _DAT_0014e760;
  lVar34 = k + 0xff;
  if (-1 < k) {
    lVar34 = k;
  }
  uVar21 = (uint)((ulong)lVar34 >> 8);
  if (0 < (int)uVar21) {
    puVar27 = y->qs + 0x38;
    puVar30 = y->qs;
    local_1a0 = 0;
    do {
      auVar14 = _DAT_0014e740;
      pcVar26 = local_138;
      lVar34 = 0;
      auVar45 = ZEXT816(0);
      pfVar33 = x;
      fVar24 = 0.0;
      fVar36 = 0.0;
      fVar41 = 0.0;
      do {
        lVar23 = lVar34 * 0x10;
        fVar43 = 0.0;
        lVar31 = 0;
        fVar49 = 0.0;
        do {
          fVar48 = ABS(pfVar33[lVar31]);
          fVar50 = fVar48;
          if (fVar48 <= fVar49) {
            fVar50 = fVar49;
          }
          fVar43 = (float)(~-(uint)(fVar49 < fVar48) & (uint)fVar43 |
                          (uint)pfVar33[lVar31] & -(uint)(fVar49 < fVar48));
          lVar31 = lVar31 + 1;
          fVar49 = fVar50;
        } while (lVar31 != 0x10);
        pcVar29 = local_138 + lVar23;
        if (1e-15 <= fVar50) {
          fVar49 = 0.0;
          fVar50 = 0.0;
          lVar31 = 0;
          do {
            fVar48 = pfVar33[lVar31];
            uVar25 = (uint)(12582912.0 - (4.0 / fVar43) * fVar48) & 0x7fffff;
            if (0x400002 < uVar25) {
              uVar25 = 0x400003;
            }
            if (uVar25 < 0x3ffffd) {
              uVar25 = 0x3ffffc;
            }
            fVar47 = (float)(int)(uVar25 - 0x400000);
            pcVar26[lVar31] = (char)uVar25;
            fVar49 = fVar49 + fVar47 * fVar48 * fVar48 * fVar47;
            fVar50 = fVar50 + fVar47 * fVar48 * fVar48 * fVar48;
            lVar31 = lVar31 + 1;
          } while (lVar31 != 0x10);
          iVar22 = 0;
          do {
            lVar31 = 0;
            iVar28 = 0;
            do {
              fVar43 = pfVar33[lVar31];
              fVar47 = fVar43 * fVar43;
              fVar51 = (float)(int)pcVar26[lVar31];
              fVar48 = fVar50 - fVar43 * fVar47 * fVar51;
              if (0.0 < fVar48) {
                fVar51 = -fVar47 * fVar51 * fVar51 + fVar49;
                uVar25 = (uint)((fVar43 * fVar51) / fVar48 + 12582912.0) & 0x7fffff;
                if (0x400002 < uVar25) {
                  uVar25 = 0x400003;
                }
                if (uVar25 < 0x3ffffd) {
                  uVar25 = 0x3ffffc;
                }
                if (uVar25 - 0x400000 != (int)pcVar26[lVar31]) {
                  fVar52 = (float)(int)(uVar25 - 0x400000);
                  fVar51 = fVar51 + fVar52 * fVar47 * fVar52;
                  fVar48 = fVar48 + fVar52 * fVar47 * fVar43;
                  if (0.0 < fVar51) {
                    if (fVar50 * fVar50 * fVar51 < fVar48 * fVar48 * fVar49) {
                      pcVar26[lVar31] = (char)uVar25;
                      iVar28 = iVar28 + 1;
                      fVar49 = fVar51;
                      fVar50 = fVar48;
                    }
                  }
                }
              }
              lVar31 = lVar31 + 1;
            } while (lVar31 != 0x10);
          } while ((iVar28 != 0) && (iVar22 = iVar22 + 1, iVar22 != 5));
          cVar2 = *(char *)(&uStack_130 + lVar34 * 2);
          cVar3 = *(char *)((long)&uStack_130 + lVar23 + 1);
          cVar4 = *(char *)((long)&uStack_130 + lVar23 + 2);
          cVar5 = *(char *)((long)&uStack_130 + lVar23 + 3);
          cVar9 = *(char *)((long)&uStack_130 + lVar23 + 4);
          cVar10 = *(char *)((long)&uStack_130 + lVar23 + 5);
          cVar11 = *(char *)((long)&uStack_130 + lVar23 + 6);
          cVar12 = *(char *)((long)&uStack_130 + lVar23 + 7);
          *pcVar29 = *pcVar29 + '\x04';
          local_138[lVar23 + 1] = local_138[lVar23 + 1] + '\x04';
          local_138[lVar23 + 2] = local_138[lVar23 + 2] + '\x04';
          local_138[lVar23 + 3] = local_138[lVar23 + 3] + '\x04';
          local_138[lVar23 + 4] = local_138[lVar23 + 4] + '\x04';
          local_138[lVar23 + 5] = local_138[lVar23 + 5] + '\x04';
          local_138[lVar23 + 6] = local_138[lVar23 + 6] + '\x04';
          local_138[lVar23 + 7] = local_138[lVar23 + 7] + '\x04';
          *(char *)(&uStack_130 + lVar34 * 2) = cVar2 + '\x04';
          *(char *)((long)&uStack_130 + lVar23 + 1) = cVar3 + '\x04';
          *(char *)((long)&uStack_130 + lVar23 + 2) = cVar4 + '\x04';
          *(char *)((long)&uStack_130 + lVar23 + 3) = cVar5 + '\x04';
          *(char *)((long)&uStack_130 + lVar23 + 4) = cVar9 + '\x04';
          *(char *)((long)&uStack_130 + lVar23 + 5) = cVar10 + '\x04';
          *(char *)((long)&uStack_130 + lVar23 + 6) = cVar11 + '\x04';
          *(char *)((long)&uStack_130 + lVar23 + 7) = cVar12 + '\x04';
          fVar49 = fVar50 / fVar49;
        }
        else {
          pcVar29[0] = '\0';
          pcVar29[1] = '\0';
          pcVar29[2] = '\0';
          pcVar29[3] = '\0';
          pcVar29[4] = '\0';
          pcVar29[5] = '\0';
          pcVar29[6] = '\0';
          pcVar29[7] = '\0';
          (&uStack_130)[lVar34 * 2] = 0;
          fVar49 = 0.0;
          fVar50 = 0.0;
        }
        afStack_178[lVar34] = fVar49;
        fVar48 = ABS(fVar49);
        fVar43 = fVar48;
        if (fVar48 <= fVar24) {
          fVar43 = fVar24;
        }
        auVar40._0_4_ = (uint)fVar49 & -(uint)(fVar24 < fVar48);
        auVar40._4_4_ = 0;
        auVar40._8_4_ = (uint)fVar50 & (uint)fVar36;
        auVar40._12_4_ = (uint)fVar50 & (uint)fVar41;
        local_188 = auVar45._0_4_;
        uStack_184 = auVar45._4_4_;
        uStack_180 = auVar45._8_4_;
        uStack_17c = auVar45._12_4_;
        auVar45._0_4_ = ~-(uint)(fVar24 < fVar48) & local_188;
        auVar45._4_4_ = uStack_184;
        auVar45._8_4_ = ~(uint)fVar36 & uStack_180;
        auVar45._12_4_ = ~(uint)fVar41 & uStack_17c;
        auVar45 = auVar45 | auVar40;
        lVar34 = lVar34 + 1;
        pfVar33 = pfVar33 + 0x10;
        pcVar26 = pcVar26 + 0x10;
        fVar24 = fVar43;
        fVar36 = ABS(fVar50);
        fVar41 = ABS(fVar50);
      } while (lVar34 != 0x10);
      pbVar1 = y + local_1a0;
      pbVar13 = y + local_1a0;
      pbVar13->scales[8] = '\0';
      pbVar13->scales[9] = '\0';
      pbVar13->scales[10] = '\0';
      pbVar13->scales[0xb] = '\0';
      pbVar13 = y + local_1a0;
      pbVar13->scales[0] = '\0';
      pbVar13->scales[1] = '\0';
      pbVar13->scales[2] = '\0';
      pbVar13->scales[3] = '\0';
      pbVar13->scales[4] = '\0';
      pbVar13->scales[5] = '\0';
      pbVar13->scales[6] = '\0';
      pbVar13->scales[7] = '\0';
      fVar24 = auVar45._0_4_;
      if ((fVar24 != 0.0) || (NAN(fVar24))) {
        uVar32 = 0;
        do {
          iVar22 = (int)SUB41(afStack_178[uVar32] * (-32.0 / fVar24) + 12582912.0,0);
          if (0x1e < iVar22) {
            iVar22 = 0x1f;
          }
          if (iVar22 < -0x1f) {
            iVar22 = -0x20;
          }
          if (uVar32 < 8) {
            puVar27[uVar32 + 8] = (byte)iVar22 & 0xf;
          }
          else {
            puVar27[uVar32] = puVar27[uVar32] | (byte)iVar22 << 4;
          }
          y[local_1a0].scales[(ulong)((uint)uVar32 & 3) + 8] =
               y[local_1a0].scales[(ulong)((uint)uVar32 & 3) + 8] |
               (byte)((iVar22 * 0x100000 + 0x2000000U >> 0x18) <<
                     ((byte)((uVar32 & 0xffffffff) >> 1) & 6));
          uVar32 = uVar32 + 1;
        } while (uVar32 != 0x10);
        fVar36 = 1.0 / (-32.0 / fVar24);
        fVar24 = (float)(((uint)fVar36 & 0x7f800000) + 0x7800000);
        if ((uint)((int)fVar36 * 2) < 0x71000000) {
          fVar24 = 2.0;
        }
        fVar24 = fVar24 + ABS(fVar36) * 5.192297e+33 * 7.70372e-34;
        uVar25 = ((uint)fVar24 & 0xfff) + ((uint)fVar24 >> 0xd & 0x7c00);
        if (0xff000000 < (uint)((int)fVar36 * 2)) {
          uVar25 = 0x7e00;
        }
        uVar25 = uVar25 | (uint)fVar36 >> 0x10 & 0x8000;
        uVar32 = (ulong)uVar25;
        pbVar1->d = (ggml_half)uVar25;
      }
      else {
        pbVar1->d = 0;
        uVar32 = 0;
      }
      fVar24 = ggml_table_f32_f16[uVar32];
      pcVar26 = local_138;
      uVar32 = 0;
      pfVar33 = x;
      do {
        if (uVar32 < 8) {
          bVar19 = y[local_1a0].scales[uVar32] & 0xf;
        }
        else {
          bVar19 = y[local_1a0].qs[uVar32 + 0x38] >> 4;
        }
        auVar42._0_4_ =
             (float)(int)(char)(((y[local_1a0].scales[(ulong)((uint)uVar32 & 3) + 8] >>
                                  ((byte)uVar32 >> 1 & 6) & 3) << 4 | bVar19) - 0x20) * fVar24;
        if ((auVar42._0_4_ != 0.0) || (NAN(auVar42._0_4_))) {
          auVar42._4_4_ = auVar42._0_4_;
          auVar42._8_4_ = auVar42._0_4_;
          auVar42._12_4_ = auVar42._0_4_;
          lVar34 = 0;
          do {
            auVar45 = divps(*(undefined1 (*) [16])(pfVar33 + lVar34),auVar42);
            fVar36 = auVar45._0_4_ + 12582912.0;
            fVar41 = auVar45._4_4_ + 12582912.0;
            auVar44._0_8_ = CONCAT44(fVar41,fVar36) & 0x7fffff007fffff;
            auVar44._8_4_ = (uint)(auVar45._8_4_ + 12582912.0) & 0x7fffff;
            auVar44._12_4_ = (uint)(auVar45._12_4_ + 12582912.0) & 0x7fffff;
            auVar46._0_4_ = -(uint)((int)((uint)fVar36 & 0x7fffff) < auVar15._0_4_);
            auVar46._4_4_ = -(uint)((int)((uint)fVar41 & 0x7fffff) < auVar15._4_4_);
            auVar46._8_4_ = -(uint)((int)auVar44._8_4_ < auVar15._8_4_);
            auVar46._12_4_ = -(uint)((int)auVar44._12_4_ < auVar15._12_4_);
            auVar45 = ~auVar46 & auVar15 | auVar44 & auVar46;
            auVar39._0_4_ = -(uint)(auVar17._0_4_ < auVar45._0_4_);
            auVar39._4_4_ = -(uint)(auVar17._4_4_ < auVar45._4_4_);
            auVar39._8_4_ = -(uint)(auVar17._8_4_ < auVar45._8_4_);
            auVar39._12_4_ = -(uint)(auVar17._12_4_ < auVar45._12_4_);
            auVar45 = (~auVar39 & auVar17 | auVar45 & auVar39) & auVar14;
            sVar6 = auVar45._0_2_;
            cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[0] - (0xff < sVar6);
            sVar6 = auVar45._2_2_;
            sVar35 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar45[2] - (0xff < sVar6),cVar2);
            sVar6 = auVar45._4_2_;
            cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[4] - (0xff < sVar6);
            sVar6 = auVar45._6_2_;
            uVar37 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar45[6] - (0xff < sVar6),
                              CONCAT12(cVar3,sVar35));
            sVar6 = auVar45._8_2_;
            cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[8] - (0xff < sVar6);
            sVar6 = auVar45._10_2_;
            uVar38 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar45[10] - (0xff < sVar6),
                              CONCAT14(cVar4,uVar37));
            sVar6 = auVar45._12_2_;
            cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[0xc] - (0xff < sVar6);
            sVar8 = auVar45._14_2_;
            sVar6 = (short)((uint)uVar37 >> 0x10);
            sVar7 = (short)((uint6)uVar38 >> 0x20);
            sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar45[0xe] - (0xff < sVar8),
                                     CONCAT16(cVar5,uVar38)) >> 0x30);
            *(uint *)(pcVar26 + lVar34) =
                 CONCAT13(((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8)) + '\x04',
                          CONCAT12(((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7)) + '\x04'
                                   ,CONCAT11(((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6)
                                             ) + '\x04',
                                             ((0 < sVar35) * (sVar35 < 0x100) * cVar2 -
                                             (0xff < sVar35)) + '\x04')));
            lVar34 = lVar34 + 4;
          } while (lVar34 != 0x10);
        }
        uVar32 = uVar32 + 1;
        pcVar26 = pcVar26 + 0x10;
        pfVar33 = pfVar33 + 0x10;
      } while (uVar32 != 0x10);
      pbVar1->hmask[0x10] = '\0';
      pbVar1->hmask[0x11] = '\0';
      pbVar1->hmask[0x12] = '\0';
      pbVar1->hmask[0x13] = '\0';
      pbVar1->hmask[0x14] = '\0';
      pbVar1->hmask[0x15] = '\0';
      pbVar1->hmask[0x16] = '\0';
      pbVar1->hmask[0x17] = '\0';
      pbVar1->hmask[0x18] = '\0';
      pbVar1->hmask[0x19] = '\0';
      pbVar1->hmask[0x1a] = '\0';
      pbVar1->hmask[0x1b] = '\0';
      pbVar1->hmask[0x1c] = '\0';
      pbVar1->hmask[0x1d] = '\0';
      pbVar1->hmask[0x1e] = '\0';
      pbVar1->hmask[0x1f] = '\0';
      pbVar1->hmask[0] = '\0';
      pbVar1->hmask[1] = '\0';
      pbVar1->hmask[2] = '\0';
      pbVar1->hmask[3] = '\0';
      pbVar1->hmask[4] = '\0';
      pbVar1->hmask[5] = '\0';
      pbVar1->hmask[6] = '\0';
      pbVar1->hmask[7] = '\0';
      pbVar1->hmask[8] = '\0';
      auVar45 = _DAT_0014e780;
      auVar14 = _DAT_0014e5e0;
      pbVar1->hmask[9] = '\0';
      pbVar1->hmask[10] = '\0';
      pbVar1->hmask[0xb] = '\0';
      pbVar1->hmask[0xc] = '\0';
      pbVar1->hmask[0xd] = '\0';
      pbVar1->hmask[0xe] = '\0';
      pbVar1->hmask[0xf] = '\0';
      lVar34 = 0;
      bVar19 = 1;
      iVar22 = 0;
      do {
        cVar2 = local_138[lVar34];
        if ('\x03' < cVar2) {
          pbVar1->hmask[iVar22] = pbVar1->hmask[iVar22] | bVar19;
          local_138[lVar34] = cVar2 + -4;
        }
        iVar28 = iVar22 + 1;
        iVar22 = iVar28;
        if (iVar28 == 0x20) {
          iVar22 = 0;
        }
        bVar19 = bVar19 << (iVar28 == 0x20);
        lVar34 = lVar34 + 1;
      } while (lVar34 != 0x100);
      uVar32 = 0;
      bVar18 = true;
      do {
        bVar20 = bVar18;
        lVar34 = 0;
        do {
          auVar40 = psllw(*(undefined1 (*) [16])(auStack_118 + lVar34 + uVar32),2);
          auVar42 = psllw(*(undefined1 (*) [16])(auStack_f8 + lVar34 + uVar32),4);
          auVar44 = psllw(*(undefined1 (*) [16])(local_d8 + lVar34 + uVar32),6);
          *(undefined1 (*) [16])(puVar30 + lVar34 + (uVar32 >> 2)) =
               auVar44 & auVar16 | auVar42 & auVar14 |
               auVar40 & auVar45 | *(undefined1 (*) [16])(local_138 + lVar34 + uVar32);
          lVar34 = lVar34 + 0x10;
        } while (lVar34 != 0x20);
        uVar32 = 0x80;
        bVar18 = false;
      } while (bVar20);
      x = x + 0x100;
      local_1a0 = local_1a0 + 1;
      puVar27 = puVar27 + 0x6e;
      puVar30 = puVar30 + 0x6e;
    } while (local_1a0 != (uVar21 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q3_K_ref(const float * GGML_RESTRICT x, block_q3_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    int8_t L[QK_K];
    float scales[QK_K / 16];

    for (int i = 0; i < nb; i++) {

        float max_scale = 0;
        float amax = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            scales[j] = make_q3_quants(16, 4, x + 16*j, L + 16*j, true);
            float scale = fabsf(scales[j]);
            if (scale > amax) {
                amax = scale; max_scale = scales[j];
            }
        }

        memset(y[i].scales, 0, 12);
        if (max_scale) {
            float iscale = -32.f/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int8_t l = nearest_int(iscale*scales[j]);
                l = MAX(-32, MIN(31, l)) + 32;
                if (j < 8) {
                    y[i].scales[j] = l & 0xF;
                } else {
                    y[i].scales[j-8] |= ((l & 0xF) << 4);
                }
                l >>= 4;
                y[i].scales[j%4 + 8] |= (l << (2*(j/4)));
            }
            y[i].d = GGML_FP32_TO_FP16(1/iscale);
        } else {
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }

        int8_t sc;
        for (int j = 0; j < QK_K/16; ++j) {
            sc = j < 8 ? y[i].scales[j] & 0xF : y[i].scales[j-8] >> 4;
            sc = (sc | (((y[i].scales[8 + j%4] >> (2*(j/4))) & 3) << 4)) - 32;
            float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-4, MIN(3, l));
                L[16*j + ii] = l + 4;
            }
        }

        memset(y[i].hmask, 0, QK_K/8);
        // We put the high-bit for the 1st 8 quants into bit 0, the next 8 into bit 1, etc.
        int m = 0;
        uint8_t hm = 1;
        for (int j = 0; j < QK_K; ++j) {
            if (L[j] > 3) {
                y[i].hmask[m] |= hm;
                L[j] -= 4;
            }
            if (++m == QK_K/8) {
                m = 0; hm <<= 1;
            }
        }
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}